

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ResolutionPass.h
# Opt level: O2

Statement * __thiscall
soul::ResolutionPass::ErrorIgnoringRewritingASTVisitor::visit
          (ErrorIgnoringRewritingASTVisitor *this,IfStatement *i)

{
  bool bVar1;
  Constant *pCVar2;
  Statement *pSVar3;
  pool_ptr<soul::AST::Constant> constant;
  pool_ptr<soul::AST::Constant> local_40;
  _Any_data local_38;
  code *local_28;
  code *local_20;
  
  if (i->isConstIf == true) {
    RewritingASTVisitor::replaceExpression(&this->super_RewritingASTVisitor,&i->condition);
    (*(((i->condition).object)->super_Statement).super_ASTObject._vptr_ASTObject[0xd])(&local_40);
    if (local_40.object == (Constant *)0x0) {
      this->numFails = this->numFails + 1;
      if (this->ignoreErrors == true) {
        local_20 = std::
                   _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonhochrein[P]soul-lsp/vendor/SOUL/source/modules/soul_core/compiler/soul_ResolutionPass.h:172:43)>
                   ::_M_invoke;
        local_28 = std::
                   _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonhochrein[P]soul-lsp/vendor/SOUL/source/modules/soul_core/compiler/soul_ResolutionPass.h:172:43)>
                   ::_M_manager;
        local_38._M_unused._M_object = this;
        local_38._8_8_ = i;
        catchParseErrors((function<void_()> *)&local_38);
        std::_Function_base::~_Function_base((_Function_base *)&local_38);
      }
    }
    else {
      pCVar2 = pool_ptr<soul::AST::Constant>::operator->(&local_40);
      bVar1 = soul::Value::getAsBool(&pCVar2->value);
      if (bVar1) {
        RewritingASTVisitor::replaceStatement(&this->super_RewritingASTVisitor,&i->trueBranch);
      }
      else if ((i->falseBranch).object != (Statement *)0x0) {
        RewritingASTVisitor::replaceStatement(&this->super_RewritingASTVisitor,&i->falseBranch);
      }
    }
    return &i->super_Statement;
  }
  pSVar3 = RewritingASTVisitor::visit(&this->super_RewritingASTVisitor,i);
  return pSVar3;
}

Assistant:

AST::Statement& visit (AST::IfStatement& i) override
        {
            if (i.isConstIf)
            {
                replaceExpression (i.condition);

                if (auto constant = i.condition->getAsConstant())
                {
                    if (constant->value.getAsBool())
                        replaceStatement (i.trueBranch);
                    else if (i.falseBranch != nullptr)
                        replaceStatement (i.falseBranch);
                }
                else
                {
                    ++numFails;

                    if (ignoreErrors)
                    {
                        catchParseErrors ([this, &i]
                        {
                            replaceStatement (i.trueBranch);
                            replaceStatement (i.falseBranch);
                        });
                    }
                }

                return i;
            }

            return RewritingASTVisitor::visit (i);
        }